

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_resampler_get_heap_size(ma_resampler_config *pConfig,size_t *pHeapSizeInBytes)

{
  bool bVar1;
  ma_result mVar2;
  ma_resampling_backend_vtable *pmVar3;
  void *pvVar4;
  
  mVar2 = MA_INVALID_ARGS;
  if ((pHeapSizeInBytes != (size_t *)0x0) &&
     (*pHeapSizeInBytes = 0, pConfig != (ma_resampler_config *)0x0)) {
    mVar2 = MA_SUCCESS;
    if (pConfig->algorithm == ma_resample_algorithm_linear) {
      bVar1 = true;
      pmVar3 = &g_ma_linear_resampler_vtable;
      pvVar4 = (void *)0x0;
    }
    else if (pConfig->algorithm == ma_resample_algorithm_custom) {
      pmVar3 = pConfig->pBackendVTable;
      pvVar4 = pConfig->pBackendUserData;
      mVar2 = MA_SUCCESS;
      bVar1 = true;
    }
    else {
      mVar2 = MA_INVALID_ARGS;
      pmVar3 = (ma_resampling_backend_vtable *)0x0;
      pvVar4 = (void *)0x0;
      bVar1 = false;
    }
    if (((bVar1) && (mVar2 = MA_NOT_IMPLEMENTED, pmVar3 != (ma_resampling_backend_vtable *)0x0)) &&
       (pmVar3->onGetHeapSize != (_func_ma_result_void_ptr_ma_resampler_config_ptr_size_t_ptr *)0x0)
       ) {
      mVar2 = (*pmVar3->onGetHeapSize)(pvVar4,pConfig,pHeapSizeInBytes);
      return mVar2;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_resampler_get_heap_size(const ma_resampler_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_resampling_backend_vtable* pVTable;
    void* pVTableUserData;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_resampler_get_vtable(pConfig, NULL, &pVTable, &pVTableUserData);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pVTable == NULL || pVTable->onGetHeapSize == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pVTable->onGetHeapSize(pVTableUserData, pConfig, pHeapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}